

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

void __thiscall RtAudio::RtAudio(RtAudio *this,Api api,RtAudioErrorCallback *errorCallback)

{
  RtApi *pRVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_d8;
  byte local_b1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  uint local_94;
  undefined1 local_90 [4];
  uint i;
  vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> apis;
  function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_70;
  string local_40 [8];
  string errorMessage;
  RtAudioErrorCallback *errorCallback_local;
  Api api_local;
  RtAudio *this_local;
  
  this->rtapi_ = (RtApi *)0x0;
  std::__cxx11::string::string(local_40);
  if (api != UNSPECIFIED) {
    openRtApi(this,api);
    if (this->rtapi_ != (RtApi *)0x0) {
      bVar2 = std::function::operator_cast_to_bool((function *)errorCallback);
      if (bVar2) {
        pRVar1 = this->rtapi_;
        std::
        function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function(&local_70,errorCallback);
        RtApi::setErrorCallback(pRVar1,&local_70);
        std::
        function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::~function(&local_70);
      }
      apis.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      goto LAB_0011c9d0;
    }
    std::__cxx11::string::operator=
              (local_40,"RtAudio: no compiled support for specified API argument!");
    bVar2 = std::function::operator_cast_to_bool((function *)errorCallback);
    if (bVar2) {
      std::
      function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(errorCallback,RTAUDIO_INVALID_USE,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,'\n');
      poVar3 = std::operator<<(poVar3,local_40);
      poVar3 = std::operator<<(poVar3,'\n');
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  std::vector<RtAudio::Api,_std::allocator<RtAudio::Api>_>::vector
            ((vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> *)local_90);
  getCompiledApi((vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> *)local_90);
  for (local_94 = 0; uVar4 = (ulong)local_94,
      sVar5 = std::vector<RtAudio::Api,_std::allocator<RtAudio::Api>_>::size
                        ((vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> *)local_90),
      uVar4 < sVar5; local_94 = local_94 + 1) {
    pvVar6 = std::vector<RtAudio::Api,_std::allocator<RtAudio::Api>_>::operator[]
                       ((vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> *)local_90,
                        (ulong)local_94);
    openRtApi(this,*pvVar6);
    local_b1 = 0;
    bVar2 = false;
    if (this->rtapi_ != (RtApi *)0x0) {
      RtApi::getDeviceNames_abi_cxx11_(&local_b0,this->rtapi_);
      local_b1 = 1;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_b0);
      bVar2 = sVar5 != 0;
    }
    if ((local_b1 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b0);
    }
    if (bVar2) break;
  }
  if (this->rtapi_ == (RtApi *)0x0) {
    std::__cxx11::string::operator=
              (local_40,"RtAudio: no compiled API support found ... critical error!");
    bVar2 = std::function::operator_cast_to_bool((function *)errorCallback);
    if (bVar2) {
      std::
      function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(errorCallback,RTAUDIO_INVALID_USE,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,'\n');
      poVar3 = std::operator<<(poVar3,local_40);
      poVar3 = std::operator<<(poVar3,'\n');
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    abort();
  }
  bVar2 = std::function::operator_cast_to_bool((function *)errorCallback);
  if (bVar2) {
    pRVar1 = this->rtapi_;
    std::
    function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_d8,errorCallback);
    RtApi::setErrorCallback(pRVar1,&local_d8);
    std::
    function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_d8);
  }
  apis.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  std::vector<RtAudio::Api,_std::allocator<RtAudio::Api>_>::~vector
            ((vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> *)local_90);
LAB_0011c9d0:
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

RtAudio :: RtAudio( RtAudio::Api api, RtAudioErrorCallback&& errorCallback )
{
  rtapi_ = 0;

  std::string errorMessage;
  if ( api != UNSPECIFIED ) {
    // Attempt to open the specified API.
    openRtApi( api );

    if ( rtapi_ ) {
      if ( errorCallback ) rtapi_->setErrorCallback( errorCallback );
      return;
    }

    // No compiled support for specified API value.  Issue a warning
    // and continue as if no API was specified.
    errorMessage = "RtAudio: no compiled support for specified API argument!";
    if ( errorCallback )
      errorCallback( RTAUDIO_INVALID_USE, errorMessage );
    else
      std::cerr << '\n' << errorMessage << '\n' << std::endl;
  }

  // Iterate through the compiled APIs and return as soon as we find
  // one with at least one device or we reach the end of the list.
  std::vector< RtAudio::Api > apis;
  getCompiledApi( apis );
  for ( unsigned int i=0; i<apis.size(); i++ ) {
    openRtApi( apis[i] );
    if ( rtapi_ && (rtapi_->getDeviceNames()).size() > 0 )
      break;
  }

  if ( rtapi_ ) {
    if ( errorCallback ) rtapi_->setErrorCallback( errorCallback );
    return;
  }

  // It should not be possible to get here because the preprocessor
  // definition __RTAUDIO_DUMMY__ is automatically defined in RtAudio.h
  // if no API-specific definitions are passed to the compiler. But just
  // in case something weird happens, issue an error message and abort.
  errorMessage = "RtAudio: no compiled API support found ... critical error!";
  if ( errorCallback )
    errorCallback( RTAUDIO_INVALID_USE, errorMessage );
  else
    std::cerr << '\n' << errorMessage << '\n' << std::endl;
  abort();
}